

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

int __thiscall glslang::TArraySizes::getCumulativeSize(TArraySizes *this)

{
  TVector<glslang::TArraySize> *pTVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int i;
  
  i = 0;
  iVar4 = 1;
  while( true ) {
    pTVar1 = (this->sizes).sizes;
    iVar2 = 0;
    if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
      iVar2 = (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar2 <= i) break;
    uVar3 = TSmallArrayVector::getDimSize(&this->sizes,i);
    if (uVar3 == 0) {
      __assert_fail("sizes.getDimSize(d) != UnsizedArraySize",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                    ,0x103,"int glslang::TArraySizes::getCumulativeSize() const");
    }
    uVar3 = TSmallArrayVector::getDimSize(&this->sizes,i);
    iVar4 = iVar4 * uVar3;
    i = i + 1;
  }
  return iVar4;
}

Assistant:

int getCumulativeSize() const
    {
        int size = 1;
        for (int d = 0; d < sizes.size(); ++d) {
            // this only makes sense in paths that have a known array size
            assert(sizes.getDimSize(d) != UnsizedArraySize);
            size *= sizes.getDimSize(d);
        }
        return size;
    }